

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O1

Bool tidyInitSink(TidyOutputSink *sink,void *snkData,TidyPutByteFunc pbFunc)

{
  if (pbFunc != (TidyPutByteFunc)0x0 && (snkData != (void *)0x0 && sink != (TidyOutputSink *)0x0)) {
    sink->sinkData = snkData;
    sink->putByte = pbFunc;
  }
  return (Bool)(pbFunc != (TidyPutByteFunc)0x0 &&
               (snkData != (void *)0x0 && sink != (TidyOutputSink *)0x0));
}

Assistant:

Bool TIDY_CALL tidyInitSink( TidyOutputSink* sink,
                             void*           snkData,
                             TidyPutByteFunc pbFunc )
{
  Bool status = ( sink && snkData && pbFunc );
  if ( status )
  {
    sink->sinkData = snkData;
    sink->putByte  = pbFunc;
  }
  return status;
}